

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * X509_parse_from_buffer(CRYPTO_BUFFER *buf)

{
  uint8_t *data;
  size_t sVar1;
  X509 *ret;
  CBS cbs;
  CRYPTO_BUFFER *buf_local;
  
  cbs.len = (size_t)buf;
  data = CRYPTO_BUFFER_data(buf);
  sVar1 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)cbs.len);
  CBS_init((CBS *)&ret,data,sVar1);
  buf_local = (CRYPTO_BUFFER *)x509_parse((CBS *)&ret,(CRYPTO_BUFFER *)cbs.len);
  if (((X509 *)buf_local == (X509 *)0x0) || (sVar1 = CBS_len((CBS *)&ret), sVar1 != 0)) {
    X509_free((X509 *)buf_local);
    buf_local = (CRYPTO_BUFFER *)0x0;
  }
  return (X509 *)buf_local;
}

Assistant:

X509 *X509_parse_from_buffer(CRYPTO_BUFFER *buf) {
  CBS cbs;
  CBS_init(&cbs, CRYPTO_BUFFER_data(buf), CRYPTO_BUFFER_len(buf));
  X509 *ret = x509_parse(&cbs, buf);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    X509_free(ret);
    return NULL;
  }

  return ret;
}